

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speaker_positioning.c
# Opt level: O2

int make_vbap_2d(vbap_data *data)

{
  byte bVar1;
  int i;
  int iVar2;
  int iVar3;
  int j;
  ulong uVar4;
  ulong uVar5;
  int smallest;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  float *pfVar9;
  ulong uVar10;
  float fVar11;
  double dVar12;
  float fVar13;
  float azimuth [33];
  int sorted [33];
  
  bVar1 = data->speaker_count;
  uVar7 = (ulong)bVar1;
  pfVar9 = data->speakers[0] + 2;
  for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
    dVar12 = acos((double)(*(float (*) [3])(pfVar9 + -2))[0]);
    fVar11 = (float)((dVar12 * 360.0) / 6.283185307179586);
    azimuth[uVar10] = fVar11;
    fVar13 = *pfVar9;
    if (0.001 <= ABS(fVar13) && ABS(fVar13) != 0.001) {
      azimuth[uVar10] = fVar11 * (fVar13 / ABS(fVar13));
    }
    pfVar9 = pfVar9 + 3;
  }
  for (uVar10 = 0; uVar10 != uVar7; uVar10 = uVar10 + 1) {
    uVar6 = 0;
    fVar13 = 1024.0;
    for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
      if (azimuth[uVar4] < fVar13) {
        uVar6 = uVar4 & 0xffffffff;
        fVar13 = azimuth[uVar4];
      }
    }
    iVar3 = (int)uVar6;
    sorted[uVar10] = iVar3;
    azimuth[iVar3] = azimuth[iVar3] + 2048.0;
  }
  for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
    azimuth[uVar10] = azimuth[uVar10] + -2048.0;
  }
  uVar8 = bVar1 - 1;
  uVar6 = 0;
  uVar10 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar10 = uVar6;
  }
  uVar4 = 0;
  while (uVar5 = uVar4, iVar3 = (int)uVar6, uVar10 != uVar5) {
    uVar4 = uVar5 + 1;
    if (azimuth[uVar5 + 1] - azimuth[uVar5] <= 170.0) {
      data->sets[uVar6].speakers[0] = (mixed_channel_t)sorted[uVar5];
      data->sets[uVar6].speakers[1] = (mixed_channel_t)sorted[uVar4];
      data->sets[uVar6].speakers[2] = 0xff;
      iVar2 = compute_set_matrix_2d(iVar3,azimuth,data);
      uVar6 = (ulong)(uint)(iVar3 + iVar2);
    }
  }
  if ((360.0 - azimuth[sorted[uVar7 - 1]]) + azimuth[sorted[0]] <= 170.0) {
    data->sets[uVar6].speakers[0] = (mixed_channel_t)sorted[uVar7 - 1];
    data->sets[uVar6].speakers[1] = (mixed_channel_t)sorted[0];
    data->sets[uVar6].speakers[2] = 0xff;
    iVar2 = compute_set_matrix_2d(iVar3,azimuth,data);
    iVar3 = iVar2 + iVar3;
  }
  if (iVar3 == 0) {
    mixed_err(8);
  }
  else {
    data->set_count = iVar3;
  }
  return (uint)(iVar3 != 0);
}

Assistant:

int make_vbap_2d(struct vbap_data *data){
  mixed_channel_t speaker_count = data->speaker_count;
  int set_count = 0;

  // Get azimuth angles in [-180, +180]
  float azimuth[MIXED_MAX_SPEAKER_COUNT];
  for(int i=0; i<speaker_count; ++i){
    azimuth[i] = acos(data->speakers[i][0]) * RAD2DEG;
    if(0.001 < fabs(data->speakers[i][2])){
      azimuth[i] *= data->speakers[i][2] / fabs(data->speakers[i][2]);
    }
  }
  
  // Sort the speakers by angle
  int sorted[MIXED_MAX_SPEAKER_COUNT];
  for(int i=0; i<speaker_count; ++i){
    float smallest_angle = 1024.0;
    int smallest = 0;
    for(int j=0; j<speaker_count; ++j){
      if(azimuth[j] < smallest_angle){
        smallest_angle = azimuth[j];
        smallest = j;
      }
    }
    sorted[i] = smallest;
    // Bias this one to not get picked again.
    azimuth[smallest] += 2048.0;
  }
  // Undo the bias.
  for(int i=0; i<speaker_count; ++i){
    azimuth[i] -= 2048.0;
  }

  // Construct pairs based on adjacent speakers
  for(int i=0; i<speaker_count-1; ++i){
    if(azimuth[i+1] - azimuth[i] <= (170)){
      data->sets[set_count].speakers[0] = sorted[i];
      data->sets[set_count].speakers[1] = sorted[i+1];
      data->sets[set_count].speakers[2] = -1;
      if(compute_set_matrix_2d(set_count, azimuth, data)){
        ++set_count;
      }
    }
  }
  if(360 - azimuth[sorted[speaker_count-1]] + azimuth[sorted[0]] <= 170){
      data->sets[set_count].speakers[0] = sorted[speaker_count-1];
      data->sets[set_count].speakers[1] = sorted[0];
      data->sets[set_count].speakers[2] = -1;
      if(compute_set_matrix_2d(set_count, azimuth, data)){
        ++set_count;
      }
  }

  if(set_count == 0){
    mixed_err(MIXED_INVALID_VALUE);
    return 0;
  }
  
  data->set_count = set_count;
  return 1;
}